

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChProximityContainerSPH.h
# Opt level: O3

void __thiscall
chrono::ChProximitySPH::Reset(ChProximitySPH *this,ChCollisionModel *mmodA,ChCollisionModel *mmodB)

{
  if (mmodA == (ChCollisionModel *)0x0) {
    __assert_fail("mmodA",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/physics/ChProximityContainerSPH.h"
                  ,0x2a,
                  "virtual void chrono::ChProximitySPH::Reset(collision::ChCollisionModel *, collision::ChCollisionModel *)"
                 );
  }
  if (mmodB != (ChCollisionModel *)0x0) {
    this->modA = mmodA;
    this->modB = mmodB;
    return;
  }
  __assert_fail("mmodB",
                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/physics/ChProximityContainerSPH.h"
                ,0x2b,
                "virtual void chrono::ChProximitySPH::Reset(collision::ChCollisionModel *, collision::ChCollisionModel *)"
               );
}

Assistant:

virtual void Reset(collision::ChCollisionModel* mmodA,  ///< model A
                       collision::ChCollisionModel* mmodB   ///< model B
                       ) {
        assert(mmodA);
        assert(mmodB);

        modA = mmodA;
        modB = mmodB;
    }